

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

bool __thiscall llvm::detail::IEEEFloat::isSignificandAllOnes(IEEEFloat *this)

{
  uint uVar1;
  uint uVar2;
  integerPart *piVar3;
  integerPart HighBitFill;
  uint local_28;
  uint NumHighBits;
  uint i;
  uint PartCount;
  integerPart *Parts;
  IEEEFloat *this_local;
  
  piVar3 = significandParts(this);
  uVar1 = partCount(this);
  local_28 = 0;
  while( true ) {
    if (uVar1 - 1 <= local_28) {
      uVar2 = (uVar1 * 0x40 - this->semantics->precision) + 1;
      if (uVar2 < 0x41) {
        return (piVar3[uVar1 - 1] | -1L << (0x40U - (char)uVar2 & 0x3f)) == 0xffffffffffffffff;
      }
      __assert_fail("NumHighBits <= integerPartWidth && \"Can not have more high bits to \" \"fill than integerPartWidth\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x314,"bool llvm::detail::IEEEFloat::isSignificandAllOnes() const");
    }
    if (piVar3[local_28] != 0xffffffffffffffff) break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool IEEEFloat::isSignificandAllOnes() const {
  // Test if the significand excluding the integral bit is all ones. This allows
  // us to test for binade boundaries.
  const integerPart *Parts = significandParts();
  const unsigned PartCount = partCount();
  for (unsigned i = 0; i < PartCount - 1; i++)
    if (~Parts[i])
      return false;

  // Set the unused high bits to all ones when we compare.
  const unsigned NumHighBits =
    PartCount*integerPartWidth - semantics->precision + 1;
  assert(NumHighBits <= integerPartWidth && "Can not have more high bits to "
         "fill than integerPartWidth");
  const integerPart HighBitFill =
    ~integerPart(0) << (integerPartWidth - NumHighBits);
  if (~(Parts[PartCount - 1] | HighBitFill))
    return false;

  return true;
}